

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O2

void __thiscall fmp4_stream::emsg::zero_set(emsg *this)

{
  std::__cxx11::string::assign((char *)&this->scheme_id_uri_,0);
  std::__cxx11::string::assign((char *)&this->value_,0);
  this->timescale_ = 0;
  this->presentation_time_delta_ = 0;
  this->presentation_time_ = 0;
  this->event_duration_ = 0;
  this->id_ = 0;
  return;
}

Assistant:

void zero_set()
		{
			scheme_id_uri_ = {};
			value_ = {};
			timescale_=0;
			presentation_time_delta_=0;
			presentation_time_=0;
			event_duration_=0;
			id_=0;
		}